

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::base::LogFormat::~LogFormat(LogFormat *this)

{
  ~LogFormat(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

virtual ~LogFormat(void) {}